

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsWebServer.cpp
# Opt level: O3

void __thiscall helics::apps::WebServer::processArgs(WebServer *this,string_view args)

{
  char *pcVar1;
  size_t sVar2;
  Option *pOVar3;
  App *pAVar4;
  Option *this_00;
  long lVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  values;
  App parser;
  _Any_data local_9f0;
  code *local_9e0;
  undefined8 uStack_9d8;
  _Any_data local_9d0;
  code *local_9c0;
  undefined8 uStack_9b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_9b0;
  undefined8 local_9a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_9a0;
  undefined4 local_990;
  undefined2 local_98c;
  string local_988;
  string local_968;
  char *local_948;
  size_t local_940;
  long *local_938;
  long local_930;
  long local_928 [2];
  string local_918;
  string local_8f8;
  string local_8d8;
  string local_8b8;
  string local_898;
  string local_878;
  string local_858;
  string local_838;
  string local_818;
  string local_7f8;
  string local_7d8;
  string local_7b8;
  string local_798;
  string local_778;
  string local_758;
  string local_738;
  string local_718;
  string local_6f8;
  string local_6d8;
  string local_6b8;
  string local_698;
  string local_678;
  string local_658;
  string local_638;
  string local_618;
  _Any_data local_5f8;
  code *local_5e8;
  undefined8 local_5e0;
  _Any_data local_5d8;
  code *local_5c8;
  undefined8 local_5c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_5b8;
  undefined8 local_5b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5a8;
  undefined4 local_598;
  undefined2 local_594;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_590;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_570;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_550;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_530;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_510;
  undefined1 *local_4f0 [2];
  undefined1 local_4e0 [16];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4d0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_490;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_450;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_410;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3d0;
  App local_390;
  
  local_618._M_dataplus._M_p = (pointer)&local_618.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_618,"http web server parser","");
  local_638._M_dataplus._M_p = (pointer)&local_638.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_638,"");
  CLI::App::App(&local_390,&local_618,&local_638);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_638._M_dataplus._M_p != &local_638.field_2) {
    operator_delete(local_638._M_dataplus._M_p,local_638.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._M_dataplus._M_p != &local_618.field_2) {
    operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
  }
  local_390.allow_extras_ = true;
  local_658._M_dataplus._M_p = (pointer)&local_658.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_658,"--http_port","");
  local_678._M_dataplus._M_p = (pointer)&local_678.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_678,"specify the http port to use","");
  pOVar3 = CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
                     (&local_390,&local_658,&this->mHttpPort,&local_678);
  local_948 = args._M_str;
  local_940 = args._M_len;
  local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_510,"HELICS_HTTP_PORT","");
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pOVar3->envname_,&local_510);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_510._M_dataplus._M_p != &local_510.field_2) {
    operator_delete(local_510._M_dataplus._M_p,local_510.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_678._M_dataplus._M_p != &local_678.field_2) {
    operator_delete(local_678._M_dataplus._M_p,local_678.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_658._M_dataplus._M_p != &local_658.field_2) {
    operator_delete(local_658._M_dataplus._M_p,local_658.field_2._M_allocated_capacity + 1);
  }
  local_698._M_dataplus._M_p = (pointer)&local_698.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_698,"--http_interface","");
  local_6b8._M_dataplus._M_p = (pointer)&local_6b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_6b8,
             "specify the interface for the http server to listen on for connections","");
  pOVar3 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (&local_390,&local_698,&this->mHttpAddress,&local_6b8);
  local_530._M_dataplus._M_p = (pointer)&local_530.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_530,"HELICS_HTTP_ADDRESS","");
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pOVar3->envname_,&local_530);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_530._M_dataplus._M_p != &local_530.field_2) {
    operator_delete(local_530._M_dataplus._M_p,local_530.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6b8._M_dataplus._M_p != &local_6b8.field_2) {
    operator_delete(local_6b8._M_dataplus._M_p,local_6b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_698._M_dataplus._M_p != &local_698.field_2) {
    operator_delete(local_698._M_dataplus._M_p,local_698.field_2._M_allocated_capacity + 1);
  }
  local_6d8._M_dataplus._M_p = (pointer)&local_6d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6d8,"http","");
  local_6f8._M_dataplus._M_p = (pointer)&local_6f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6f8,"");
  pAVar4 = CLI::App::add_subcommand(&local_390,&local_6d8,&local_6f8);
  pAVar4->fallthrough_ = true;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6f8._M_dataplus._M_p != &local_6f8.field_2) {
    operator_delete(local_6f8._M_dataplus._M_p,local_6f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
    operator_delete(local_6d8._M_dataplus._M_p,local_6d8.field_2._M_allocated_capacity + 1);
  }
  local_718._M_dataplus._M_p = (pointer)&local_718.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_718,"--port","");
  local_738._M_dataplus._M_p = (pointer)&local_738.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_738,"specify the http port to use","");
  CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
            (pAVar4,&local_718,&this->mHttpPort,&local_738);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_738._M_dataplus._M_p != &local_738.field_2) {
    operator_delete(local_738._M_dataplus._M_p,local_738.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_718._M_dataplus._M_p != &local_718.field_2) {
    operator_delete(local_718._M_dataplus._M_p,local_718.field_2._M_allocated_capacity + 1);
  }
  local_758._M_dataplus._M_p = (pointer)&local_758.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_758,"--interface","");
  local_778._M_dataplus._M_p = (pointer)&local_778.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_778,
             "specify the interface for the http server to listen on for connections","");
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar4,&local_758,&this->mHttpAddress,&local_778);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_778._M_dataplus._M_p != &local_778.field_2) {
    operator_delete(local_778._M_dataplus._M_p,local_778.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_758._M_dataplus._M_p != &local_758.field_2) {
    operator_delete(local_758._M_dataplus._M_p,local_758.field_2._M_allocated_capacity + 1);
  }
  local_798._M_dataplus._M_p = (pointer)&local_798.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_798,"--websocket_port","");
  local_7b8._M_dataplus._M_p = (pointer)&local_7b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_7b8,"specify the websocket port to use","");
  pOVar3 = CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
                     (&local_390,&local_798,&this->mWebsocketPort,&local_7b8);
  local_550._M_dataplus._M_p = (pointer)&local_550.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_550,"HELICS_WEBSOCKET_PORT","");
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pOVar3->envname_,&local_550);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550._M_dataplus._M_p != &local_550.field_2) {
    operator_delete(local_550._M_dataplus._M_p,local_550.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b8._M_dataplus._M_p != &local_7b8.field_2) {
    operator_delete(local_7b8._M_dataplus._M_p,local_7b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_798._M_dataplus._M_p != &local_798.field_2) {
    operator_delete(local_798._M_dataplus._M_p,local_798.field_2._M_allocated_capacity + 1);
  }
  local_7d8._M_dataplus._M_p = (pointer)&local_7d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7d8,"--websocket_interface","");
  local_7f8._M_dataplus._M_p = (pointer)&local_7f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_7f8,
             "specify the interface for the websocket server to listen on for connections","");
  pOVar3 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (&local_390,&local_7d8,&this->mWebsocketAddress,&local_7f8);
  local_570._M_dataplus._M_p = (pointer)&local_570.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_570,"HELICS_WEBSOCKET_ADDRESS","");
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pOVar3->envname_,&local_570);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_570._M_dataplus._M_p != &local_570.field_2) {
    operator_delete(local_570._M_dataplus._M_p,local_570.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f8._M_dataplus._M_p != &local_7f8.field_2) {
    operator_delete(local_7f8._M_dataplus._M_p,local_7f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7d8._M_dataplus._M_p != &local_7d8.field_2) {
    operator_delete(local_7d8._M_dataplus._M_p,local_7d8.field_2._M_allocated_capacity + 1);
  }
  local_818._M_dataplus._M_p = (pointer)&local_818.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_818,"websocket","");
  local_838._M_dataplus._M_p = (pointer)&local_838.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_838,"");
  pAVar4 = CLI::App::add_subcommand(&local_390,&local_818,&local_838);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_838._M_dataplus._M_p != &local_838.field_2) {
    operator_delete(local_838._M_dataplus._M_p,local_838.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_818._M_dataplus._M_p != &local_818.field_2) {
    operator_delete(local_818._M_dataplus._M_p,local_818.field_2._M_allocated_capacity + 1);
  }
  local_858._M_dataplus._M_p = (pointer)&local_858.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_858,"--port","");
  local_878._M_dataplus._M_p = (pointer)&local_878.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_878,"specify the websocket port to use","");
  CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
            (pAVar4,&local_858,&this->mWebsocketPort,&local_878);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_878._M_dataplus._M_p != &local_878.field_2) {
    operator_delete(local_878._M_dataplus._M_p,local_878.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_858._M_dataplus._M_p != &local_858.field_2) {
    operator_delete(local_858._M_dataplus._M_p,local_858.field_2._M_allocated_capacity + 1);
  }
  local_898._M_dataplus._M_p = (pointer)&local_898.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_898,"--interface","");
  local_8b8._M_dataplus._M_p = (pointer)&local_8b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_8b8,
             "specify the interface for the websocket server to listen on for connections","");
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar4,&local_898,&this->mWebsocketAddress,&local_8b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8b8._M_dataplus._M_p != &local_8b8.field_2) {
    operator_delete(local_8b8._M_dataplus._M_p,local_8b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_898._M_dataplus._M_p != &local_898.field_2) {
    operator_delete(local_898._M_dataplus._M_p,local_898.field_2._M_allocated_capacity + 1);
  }
  local_8d8._M_dataplus._M_p = (pointer)&local_8d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_8d8,"--local{0},--ipv4{4},--ipv6{6},--all{10},--external{10}","");
  local_8f8._M_dataplus._M_p = (pointer)&local_8f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_8f8,"specify external interface to use, default is --local","");
  pOVar3 = CLI::App::add_flag<int,_(CLI::detail::enabler)0>
                     (&local_390,&local_8d8,&this->mInterfaceNetwork,&local_8f8);
  (pOVar3->super_OptionBase<CLI::Option>).disable_flag_override_ = true;
  local_590._M_dataplus._M_p = (pointer)&local_590.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_590,"HELICS_WEBSERVER_INTERFACE","");
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pOVar3->envname_,&local_590);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_590._M_dataplus._M_p != &local_590.field_2) {
    operator_delete(local_590._M_dataplus._M_p,local_590.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8f8._M_dataplus._M_p != &local_8f8.field_2) {
    operator_delete(local_8f8._M_dataplus._M_p,local_8f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d8._M_dataplus._M_p != &local_8d8.field_2) {
    operator_delete(local_8d8._M_dataplus._M_p,local_8d8.field_2._M_allocated_capacity + 1);
  }
  local_968._M_dataplus._M_p = (pointer)&local_968.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_968,"--network_connectivity","");
  local_988._M_dataplus._M_p = (pointer)&local_988.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_988,"specify the connectivity of the network interface","");
  this_00 = CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
                      (&local_390,&local_968,&this->mInterfaceNetwork,&local_988);
  CLI::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_const_char_(&)[2],_true>
            (&local_4d0,(char (*) [6])0x41fa35,(char (*) [2])0x456c13);
  CLI::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[5],_const_char_(&)[2],_true>
            (&local_490,(char (*) [5])"ipv4",(char (*) [2])0x450744);
  CLI::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[5],_const_char_(&)[2],_true>
            (&local_450,(char (*) [5])"ipv6",(char (*) [2])0x45a20f);
  CLI::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[9],_const_char_(&)[3],_true>
            (&local_410,(char (*) [9])"external",(char (*) [3])0x450ac5);
  CLI::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[4],_const_char_(&)[3],_true>
            (&local_3d0,(char (*) [4])0x44b85c,(char (*) [3])0x450ac5);
  values._M_len = 5;
  values._M_array = &local_4d0;
  CLI::CheckedTransformer::CheckedTransformer<>((CheckedTransformer *)&local_9f0,values);
  local_5f8._M_unused._M_object = (void *)0x0;
  local_5f8._8_8_ = 0;
  local_5e8 = (code *)0x0;
  local_5e0 = uStack_9d8;
  if (local_9e0 != (code *)0x0) {
    local_5f8._M_unused._M_object = local_9f0._M_unused._M_object;
    local_5f8._8_8_ = local_9f0._8_8_;
    local_5e8 = local_9e0;
    local_9e0 = (code *)0x0;
    uStack_9d8 = 0;
  }
  local_5d8._M_unused._M_object = (void *)0x0;
  local_5d8._8_8_ = 0;
  local_5c8 = (code *)0x0;
  local_5c0 = uStack_9b8;
  if (local_9c0 != (code *)0x0) {
    local_5d8._M_unused._M_object = local_9d0._M_unused._M_object;
    local_5d8._8_8_ = local_9d0._8_8_;
    local_5c8 = local_9c0;
    local_9c0 = (code *)0x0;
    uStack_9b8 = 0;
  }
  if (local_9b0 == &local_9a0) {
    local_5a8._8_4_ = local_9a0._8_4_;
    local_5a8._12_4_ = local_9a0._12_4_;
    local_5b8 = &local_5a8;
  }
  else {
    local_5b8 = local_9b0;
  }
  local_5a8._M_allocated_capacity._4_4_ = local_9a0._M_allocated_capacity._4_4_;
  local_5a8._M_allocated_capacity._0_4_ = local_9a0._M_allocated_capacity._0_4_;
  local_5b0 = local_9a8;
  local_9a8 = 0;
  local_9a0._M_allocated_capacity._0_4_ = local_9a0._M_allocated_capacity._0_4_ & 0xffffff00;
  local_598 = local_990;
  local_594 = local_98c;
  local_9b0 = &local_9a0;
  local_938 = local_928;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_938,"");
  CLI::std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>::_M_insert_rval
            (&this_00->validators_,
             (this_00->validators_).
             super__Vector_base<CLI::Validator,_std::allocator<CLI::Validator>_>._M_impl.
             super__Vector_impl_data._M_start,(value_type *)&local_5f8);
  if (local_930 != 0) {
    local_4f0[0] = local_4e0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_4f0,local_938,local_930 + (long)local_938);
    processArgs();
  }
  CLI::Option::excludes(this_00,pOVar3);
  if (local_938 != local_928) {
    operator_delete(local_938,local_928[0] + 1);
  }
  sVar2 = local_940;
  pcVar1 = local_948;
  if (local_5b8 != &local_5a8) {
    operator_delete(local_5b8,local_5a8._M_allocated_capacity + 1);
  }
  if (local_5c8 != (code *)0x0) {
    (*local_5c8)(&local_5d8,&local_5d8,__destroy_functor);
  }
  if (local_5e8 != (code *)0x0) {
    (*local_5e8)(&local_5f8,&local_5f8,__destroy_functor);
  }
  if (local_9b0 != &local_9a0) {
    operator_delete(local_9b0,
                    CONCAT44(local_9a0._M_allocated_capacity._4_4_,
                             local_9a0._M_allocated_capacity._0_4_) + 1);
  }
  if (local_9c0 != (code *)0x0) {
    (*local_9c0)(&local_9d0,&local_9d0,__destroy_functor);
  }
  if (local_9e0 != (code *)0x0) {
    (*local_9e0)(&local_9f0,&local_9f0,__destroy_functor);
  }
  lVar5 = -0x140;
  paVar6 = &local_3d0.second.field_2;
  do {
    if (paVar6 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(&paVar6->_M_allocated_capacity)[-2]) {
      operator_delete((long *)(&paVar6->_M_allocated_capacity)[-2],paVar6->_M_allocated_capacity + 1
                     );
    }
    if (&paVar6->_M_allocated_capacity + -4 != (size_type *)(&paVar6->_M_allocated_capacity)[-6]) {
      operator_delete((size_type *)(&paVar6->_M_allocated_capacity)[-6],
                      (&paVar6->_M_allocated_capacity)[-4] + 1);
    }
    paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(&paVar6->_M_allocated_capacity + -8);
    lVar5 = lVar5 + 0x40;
  } while (lVar5 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_988._M_dataplus._M_p != &local_988.field_2) {
    operator_delete(local_988._M_dataplus._M_p,local_988.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_968._M_dataplus._M_p != &local_968.field_2) {
    operator_delete(local_968._M_dataplus._M_p,local_968.field_2._M_allocated_capacity + 1);
  }
  local_918._M_dataplus._M_p = (pointer)&local_918.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_918,pcVar1,pcVar1 + sVar2);
  CLI::App::parse(&local_390,&local_918,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_918._M_dataplus._M_p != &local_918.field_2) {
    operator_delete(local_918._M_dataplus._M_p,local_918.field_2._M_allocated_capacity + 1);
  }
  CLI::App::~App(&local_390);
  return;
}

Assistant:

void WebServer::processArgs(std::string_view args)

{
    CLI::App parser("http web server parser");
    parser.allow_extras();
    parser.add_option("--http_port", mHttpPort, "specify the http port to use")
        ->envname("HELICS_HTTP_PORT");
    parser
        .add_option("--http_interface",
                    mHttpAddress,
                    "specify the interface for the http server to listen on for connections")
        ->envname("HELICS_HTTP_ADDRESS");
    auto* httpsub = parser.add_subcommand("http")->fallthrough();
    httpsub->add_option("--port", mHttpPort, "specify the http port to use");
    httpsub->add_option("--interface",
                        mHttpAddress,
                        "specify the interface for the http server to listen on for connections");

    parser.add_option("--websocket_port", mWebsocketPort, "specify the websocket port to use")
        ->envname("HELICS_WEBSOCKET_PORT");
    parser
        .add_option("--websocket_interface",
                    mWebsocketAddress,
                    "specify the interface for the websocket server to listen on for connections")
        ->envname("HELICS_WEBSOCKET_ADDRESS");

    auto* websub = parser.add_subcommand("websocket");
    websub->add_option("--port", mWebsocketPort, "specify the websocket port to use");
    websub->add_option(
        "--interface",
        mWebsocketAddress,
        "specify the interface for the websocket server to listen on for connections");
    auto* niflag = parser
                       .add_flag("--local{0},--ipv4{4},--ipv6{6},--all{10},--external{10}",
                                 mInterfaceNetwork,
                                 "specify external interface to use, default is --local")
                       ->disable_flag_override()
                       ->envname("HELICS_WEBSERVER_INTERFACE");

    parser
        .add_option("--network_connectivity",
                    mInterfaceNetwork,
                    "specify the connectivity of the network interface")
        ->transform(CLI::CheckedTransformer(
            {{"local", "0"}, {"ipv4", "4"}, {"ipv6", "6"}, {"external", "10"}, {"all", "10"}}))
        ->excludes(niflag);

    try {
        parser.parse(std::string(args));
    }
    catch (const CLI::Error& ce) {
        logMessage(std::string("error processing command line arguments for web server :") +
                   ce.what());
    }
}